

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O1

JavascriptExternalFunction * __thiscall
Js::JavascriptLibrary::CreateWrappedExternalFunction
          (JavascriptLibrary *this,JavascriptExternalFunction *wrappedFunction)

{
  int iVar1;
  Recycler *alloc;
  JavascriptExternalFunction *this_00;
  undefined4 extraout_var;
  undefined1 local_48 [8];
  TrackAllocData data;
  
  local_48 = (undefined1  [8])&JavascriptExternalFunction::typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_766a001;
  data.filename._0_4_ = 0x1a2e;
  alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_48);
  this_00 = (JavascriptExternalFunction *)new<Memory::Recycler>(0x70,alloc,0x38bbb2);
  JavascriptExternalFunction::JavascriptExternalFunction
            (this_00,wrappedFunction,(this->wrappedFunctionWithDeferredPrototypeType).ptr);
  iVar1 = (*(wrappedFunction->super_RuntimeFunction).super_JavascriptFunction.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x6c])(wrappedFunction);
  RuntimeFunction::SetFunctionNameId((RuntimeFunction *)this_00,(Var)CONCAT44(extraout_var,iVar1));
  return this_00;
}

Assistant:

JavascriptExternalFunction* JavascriptLibrary::CreateWrappedExternalFunction(JavascriptExternalFunction* wrappedFunction)
    {
        // The wrapped function will have profiling, so the wrapper function does not need it.
        JavascriptExternalFunction* function = RecyclerNew(this->GetRecycler(), JavascriptExternalFunction, wrappedFunction, wrappedFunctionWithDeferredPrototypeType);
        function->SetFunctionNameId(wrappedFunction->GetSourceString());

        return function;
    }